

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O3

void __thiscall
amrex::MLLinOp::getEBFluxes
          (MLLinOp *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *param_1,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *param_2)

{
  Abort_host("MLLinOp::getEBFluxes: How did we get here?");
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Abort (const char * msg = 0) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Abort %s\n", msg);
        AMREX_DEVICE_ASSERT(0);
#endif
#else
        Abort_host(msg);
#endif
    }